

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_after_rect
                (ExtPartController *ext_part_controller,int is_intra_frame,
                float *features_after_rect,int *horza_partition_allowed,int *horzb_partition_allowed
                ,int *verta_partition_allowed,int *vertb_partition_allowed)

{
  _Bool _Var1;
  undefined4 *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined4 *in_stack_00000008;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  int i;
  aom_partition_features_t features;
  undefined7 in_stack_ffffffffffffd480;
  undefined1 in_stack_ffffffffffffd487;
  ExtPartController *in_stack_ffffffffffffd488;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  int local_b34;
  undefined4 auStack_964 [587];
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  _Bool local_1;
  
  if ((in_ESI == 0) && (*in_RDI != 0)) {
    for (local_b34 = 0; local_b34 < 10; local_b34 = local_b34 + 1) {
      auStack_964[local_b34] = *(undefined4 *)(in_RDX + (long)local_b34 * 4);
    }
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    av1_ext_part_send_features
              (in_stack_ffffffffffffd488,
               (aom_partition_features_t *)
               CONCAT17(in_stack_ffffffffffffd487,in_stack_ffffffffffffd480));
    _Var1 = av1_ext_part_get_partition_decision
                      (in_stack_ffffffffffffd488,
                       (aom_partition_decision_t *)
                       CONCAT17(in_stack_ffffffffffffd487,in_stack_ffffffffffffd480));
    if (_Var1) {
      *local_28 = local_b4c;
      *local_30 = local_b48;
      *local_38 = local_b44;
      *in_stack_00000008 = local_b40;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ext_ml_model_decision_after_rect(
    ExtPartController *const ext_part_controller, const int is_intra_frame,
    const float *const features_after_rect, int *horza_partition_allowed,
    int *horzb_partition_allowed, int *verta_partition_allowed,
    int *vertb_partition_allowed) {
  if (is_intra_frame || !ext_part_controller->ready) return false;

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_AFTER_RECT;
  for (int i = 0; i < 10; ++i) {
    features.after_part_rect.f[i] = features_after_rect[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *horza_partition_allowed = decision.horza_partition_allowed;
  *horzb_partition_allowed = decision.horzb_partition_allowed;
  *verta_partition_allowed = decision.verta_partition_allowed;
  *vertb_partition_allowed = decision.vertb_partition_allowed;

  return true;
}